

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

void mbedtls_ssl_read_version(int *major,int *minor,int transport,uchar *ver)

{
  uchar *ver_local;
  int transport_local;
  int *minor_local;
  int *major_local;
  
  if (transport == 1) {
    *major = 0x101 - (uint)*ver;
    *minor = 0x100 - (uint)ver[1];
    if (*minor == 1) {
      *minor = *minor + 1;
    }
  }
  else {
    *major = (uint)*ver;
    *minor = (uint)ver[1];
  }
  return;
}

Assistant:

void mbedtls_ssl_read_version( int *major, int *minor, int transport,
                       const unsigned char ver[2] )
{
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        *major = 255 - ver[0] + 2;
        *minor = 255 - ver[1] + 1;

        if( *minor == MBEDTLS_SSL_MINOR_VERSION_1 )
            ++*minor; /* DTLS 1.0 stored as TLS 1.1 internally */
    }
    else
#else
    ((void) transport);
#endif
    {
        *major = ver[0];
        *minor = ver[1];
    }
}